

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  undefined8 in_RAX;
  char ret;
  undefined1 auStack_18 [3];
  char local_15;
  unsigned_short local_14;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_12;
  
  auStack_18 = SUB83(in_RAX,0);
  local_12.m_int = (unsigned_short)((ulong)in_RAX >> 0x30);
  _auStack_18 = CONCAT24(rhs.m_int,CONCAT13(lhs,auStack_18)) & 0xffffff00ffff;
  DivisionHelper<signed_char,_unsigned_short,_4>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_15,&local_14,auStack_18 + 2);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::
  SafeInt<signed_char>(&local_12,auStack_18 + 2);
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         local_12.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}